

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_pedersen_verify_tally
              (secp256k1_context *ctx,secp256k1_pedersen_commitment **commits,size_t pcnt,
              secp256k1_pedersen_commitment **ncommits,size_t ncnt)

{
  void *pvVar1;
  char *pcVar2;
  size_t sVar3;
  secp256k1_gej accj;
  secp256k1_ge add;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  if (commits == (secp256k1_pedersen_commitment **)0x0 && pcnt != 0) {
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "!pcnt || (commits != NULL)";
  }
  else {
    if (ncommits != (secp256k1_pedersen_commitment **)0x0 || ncnt == 0) {
      secp256k1_gej_set_infinity(&local_108);
      for (sVar3 = 0; ncnt != sVar3; sVar3 = sVar3 + 1) {
        secp256k1_pedersen_commitment_load(&local_88,ncommits[sVar3]);
        secp256k1_gej_add_ge_var(&local_108,&local_108,&local_88,(secp256k1_fe *)0x0);
      }
      secp256k1_gej_neg(&local_108,&local_108);
      for (sVar3 = 0; pcnt != sVar3; sVar3 = sVar3 + 1) {
        secp256k1_pedersen_commitment_load(&local_88,commits[sVar3]);
        secp256k1_gej_add_ge_var(&local_108,&local_108,&local_88,(secp256k1_fe *)0x0);
      }
      return local_108.infinity;
    }
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "!ncnt || (ncommits != NULL)";
  }
  (*(ctx->illegal_callback).fn)(pcVar2,pvVar1);
  return 0;
}

Assistant:

int secp256k1_pedersen_verify_tally(const secp256k1_context* ctx, const secp256k1_pedersen_commitment * const* commits, size_t pcnt, const secp256k1_pedersen_commitment * const* ncommits, size_t ncnt) {
    secp256k1_gej accj;
    secp256k1_ge add;
    size_t i;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(!pcnt || (commits != NULL));
    ARG_CHECK(!ncnt || (ncommits != NULL));
    (void) ctx;
    secp256k1_gej_set_infinity(&accj);
    for (i = 0; i < ncnt; i++) {
        secp256k1_pedersen_commitment_load(&add, ncommits[i]);
        secp256k1_gej_add_ge_var(&accj, &accj, &add, NULL);
    }
    secp256k1_gej_neg(&accj, &accj);
    for (i = 0; i < pcnt; i++) {
        secp256k1_pedersen_commitment_load(&add, commits[i]);
        secp256k1_gej_add_ge_var(&accj, &accj, &add, NULL);
    }
    return secp256k1_gej_is_infinity(&accj);
}